

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addDynamicReadOnlyStringHandler
          (SNMPAgent *this,char *oid,GETSTRING_FUNC callback_func,bool overwritePrefix)

{
  SortableOIDType *oid_00;
  DynamicStringCallback *this_00;
  SortableOIDType *oidType;
  bool overwritePrefix_local;
  GETSTRING_FUNC callback_func_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
  if (oid_00 == (SortableOIDType *)0x0) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    this_00 = (DynamicStringCallback *)operator_new(0x20);
    DynamicStringCallback::DynamicStringCallback(this_00,oid_00,callback_func);
    this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,false);
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addDynamicReadOnlyStringHandler(const char *oid, GETSTRING_FUNC callback_func, bool overwritePrefix){
    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) {
        return nullptr;
    }
    return addHandler(new DynamicStringCallback(oidType, callback_func), false);
}